

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void __thiscall
duckdb::WindowQuantileState<duckdb::interval_t>::SkipListUpdater::Right
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  DataChunk *pDVar1;
  interval_t *piVar2;
  unsigned_long *puVar3;
  CURSOR_TYPE *pCVar4;
  HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *this_00;
  CursorType *pCVar5;
  reference pvVar6;
  ulong uVar7;
  pair<unsigned_long,_duckdb::interval_t> local_48;
  
  if (begin < end) {
    do {
      puVar3 = (this->included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[begin >> 6] >> (begin & 0x3f) & 1) != 0)) {
        pCVar4 = this->included->dmask;
        if (((pCVar4->scan).next_row_index <= begin) || (begin < (pCVar4->scan).current_row_index))
        {
          pDVar1 = &pCVar4->page;
          ColumnDataCollection::Seek(pCVar4->inputs,begin,&pCVar4->scan,pDVar1);
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
          pCVar4->data = (interval_t *)pvVar6->data;
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
          FlatVector::VerifyFlatVector(pvVar6);
          pCVar4->validity = &pvVar6->validity;
        }
        puVar3 = (pCVar4->validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) ||
           (uVar7 = begin - (pCVar4->scan).current_row_index,
           (puVar3[uVar7 >> 6 & 0x3ffffff] >> (uVar7 & 0x3f) & 1) != 0)) {
          this_00 = this->skip;
          pCVar5 = this->data;
          if (((pCVar5->scan).next_row_index <= begin) || (begin < (pCVar5->scan).current_row_index)
             ) {
            pDVar1 = &pCVar5->page;
            ColumnDataCollection::Seek(pCVar5->inputs,begin,&pCVar5->scan,pDVar1);
            pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
            pCVar5->data = (interval_t *)pvVar6->data;
            pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
            FlatVector::VerifyFlatVector(pvVar6);
            pCVar5->validity = &pvVar6->validity;
          }
          piVar2 = pCVar5->data + (uint)((int)begin - (int)(pCVar5->scan).current_row_index);
          local_48.second.months = piVar2->months;
          local_48.second.days = piVar2->days;
          local_48.second.micros = piVar2->micros;
          local_48.first = begin;
          duckdb_skiplistlib::skip_list::
          HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
          ::insert(this_00,&local_48);
        }
      }
      begin = begin + 1;
    } while (end != begin);
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.insert(SkipType(begin, data[begin]));
				}
			}
		}